

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_write_resp_hd(Curl_easy *data,char *hd,size_t hdlen,_Bool is_eos)

{
  char local_31;
  char tmp;
  size_t consumed;
  CURLcode result;
  _Bool is_eos_local;
  size_t hdlen_local;
  char *hd_local;
  Curl_easy *data_local;
  
  local_31 = '\0';
  consumed._7_1_ = is_eos;
  _result = hdlen;
  hdlen_local = (size_t)hd;
  hd_local = (char *)data;
  consumed._0_4_ = http_rw_hd(data,hd,hdlen,&local_31,0,(size_t *)&stack0xffffffffffffffd0);
  if (((CURLcode)consumed == CURLE_OK) && ((consumed._7_1_ & 1) != 0)) {
    consumed._0_4_ = Curl_client_write((Curl_easy *)hd_local,0x81,&local_31,0);
  }
  return (CURLcode)consumed;
}

Assistant:

CURLcode Curl_http_write_resp_hd(struct Curl_easy *data,
                                 const char *hd, size_t hdlen,
                                 bool is_eos)
{
  CURLcode result;
  size_t consumed;
  char tmp = 0;

  result = http_rw_hd(data, hd, hdlen, &tmp, 0, &consumed);
  if(!result && is_eos) {
    result = Curl_client_write(data, (CLIENTWRITE_BODY|CLIENTWRITE_EOS),
                               &tmp, 0);
  }
  return result;
}